

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  ostream *poVar17;
  Message msg;
  int pipe_fd [2];
  ulong *local_128;
  long local_120;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  int local_84;
  int local_80;
  int local_7c;
  string local_78;
  string local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_108,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                       ,0x462);
    Message::Message((Message *)&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10),
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10)," in a threaded context. For this test, ",
               0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10)," ",1);
    poVar17 = (ostream *)(local_c8._M_head_impl + 0x10);
    if (sVar4 == 0) {
      pcVar14 = "couldn\'t detect the number of threads.";
      lVar13 = 0x26;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_c8._M_head_impl + 0x10));
      poVar17 = (ostream *)(local_c8._M_head_impl + 0x10);
      pcVar14 = " threads.";
      lVar13 = 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar14,lVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10),
               " See https://github.com/google/googletest/blob/master/googletest/docs/advanced.md#death-tests-and-threads"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10),
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_c8._M_head_impl + 0x10),
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_a8,local_c8._M_head_impl);
    if (local_c8._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_108);
  }
  iVar2 = pipe(&local_84);
  if (iVar2 == -1) {
    local_38 = &local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_38);
    local_e8 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_e8 == puVar9) {
      local_d8 = *puVar9;
      lStack_d0 = puVar7[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar9;
    }
    local_e0 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    local_128 = (ulong *)*puVar7;
    puVar9 = puVar7 + 2;
    if (local_128 == puVar9) {
      local_118 = *puVar9;
      uStack_110 = puVar7[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *puVar9;
    }
    local_120 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_58._M_dataplus._M_p._0_4_ = 0x466;
    StreamableToString<int>(&local_78,(int *)&local_58);
    uVar15 = 0xf;
    if (local_128 != &local_118) {
      uVar15 = local_118;
    }
    if (uVar15 < local_78._M_string_length + local_120) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar16 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_78._M_string_length + local_120) goto LAB_00148be1;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_128);
    }
    else {
LAB_00148be1:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_78._M_dataplus._M_p);
    }
    local_108 = (undefined8 *)*puVar7;
    puVar10 = puVar7 + 2;
    if (local_108 == puVar10) {
      local_f8 = *puVar10;
      uStack_f0 = puVar7[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *puVar10;
    }
    local_100 = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
    pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar7 + 2);
    if (local_c8._M_head_impl == pbVar12) {
      local_b8 = *(long *)pbVar12;
      lStack_b0 = puVar7[3];
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
    }
    else {
      local_b8 = *(long *)pbVar12;
    }
    local_c0 = puVar7[1];
    *puVar7 = pbVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_a8._M_dataplus._M_p = (pointer)*plVar6;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_a8._M_dataplus._M_p == psVar11) {
      local_a8.field_2._M_allocated_capacity = *psVar11;
      local_a8.field_2._8_8_ = plVar6[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      goto LAB_00148a23;
    }
  }
  else {
    paVar1 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 == -1) {
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CHECK failed: File ","");
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_38);
      local_e8 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_e8 == puVar9) {
        local_d8 = *puVar9;
        lStack_d0 = puVar7[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *puVar9;
      }
      local_e0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
      local_128 = (ulong *)*puVar7;
      puVar9 = puVar7 + 2;
      if (local_128 == puVar9) {
        local_118 = *puVar9;
        uStack_110 = puVar7[3];
        local_128 = &local_118;
      }
      else {
        local_118 = *puVar9;
      }
      local_120 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_58._M_dataplus._M_p._0_4_ = 0x474;
      StreamableToString<int>(&local_78,(int *)&local_58);
      uVar15 = 0xf;
      if (local_128 != &local_118) {
        uVar15 = local_118;
      }
      if (uVar15 < local_78._M_string_length + local_120) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar16 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_78._M_string_length + local_120) goto LAB_00148cd7;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_128);
      }
      else {
LAB_00148cd7:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_128,(ulong)local_78._M_dataplus._M_p);
      }
      local_108 = (undefined8 *)*puVar7;
      puVar10 = puVar7 + 2;
      if (local_108 == puVar10) {
        local_f8 = *puVar10;
        uStack_f0 = puVar7[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *puVar10;
      }
      local_100 = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
      pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (puVar7 + 2);
      if (local_c8._M_head_impl == pbVar12) {
        local_b8 = *(long *)pbVar12;
        lStack_b0 = puVar7[3];
        local_c8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
      }
      else {
        local_b8 = *(long *)pbVar12;
      }
      local_c0 = puVar7[1];
      *puVar7 = pbVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
    }
    else {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(local_84);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_80;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"CHECK failed: File ","");
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        local_38 = (long *)*puVar7;
        plVar6 = puVar7 + 2;
        if (local_38 == plVar6) {
          local_28 = *plVar6;
          lStack_20 = puVar7[3];
          local_38 = &local_28;
        }
        else {
          local_28 = *plVar6;
        }
        local_30 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_38);
        local_e8 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_e8 == puVar9) {
          local_d8 = *puVar9;
          lStack_d0 = puVar7[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *puVar9;
        }
        local_e0 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_7c = 0x477;
        StreamableToString<int>(&local_58,&local_7c);
        uVar15 = 0xf;
        if (local_e8 != &local_d8) {
          uVar15 = local_d8;
        }
        if (uVar15 < local_58._M_string_length + local_e0) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
              &local_58.field_2) {
            uVar16 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_58._M_string_length + local_e0) goto LAB_0014880e;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_e8);
        }
        else {
LAB_0014880e:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e8,
                              CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                       local_58._M_dataplus._M_p._0_4_));
        }
        local_128 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_128 == puVar9) {
          local_118 = *puVar9;
          uStack_110 = puVar7[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar9;
        }
        local_120 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        local_108 = (undefined8 *)*puVar7;
        puVar10 = puVar7 + 2;
        if (local_108 == puVar10) {
          local_f8 = *puVar10;
          uStack_f0 = puVar7[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar10;
        }
        local_100 = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
      }
      else {
        do {
          iVar2 = close(local_80);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_84;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"CHECK failed: File ","");
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_38 = (long *)*plVar6;
        plVar8 = plVar6 + 2;
        if (local_38 == plVar8) {
          local_28 = *plVar8;
          lStack_20 = plVar6[3];
          local_38 = &local_28;
        }
        else {
          local_28 = *plVar8;
        }
        local_30 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
        local_e8 = (ulong *)*plVar6;
        puVar9 = (ulong *)(plVar6 + 2);
        if (local_e8 == puVar9) {
          local_d8 = *puVar9;
          lStack_d0 = plVar6[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *puVar9;
        }
        local_e0 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_7c = 0x483;
        StreamableToString<int>(&local_58,&local_7c);
        uVar15 = 0xf;
        if (local_e8 != &local_d8) {
          uVar15 = local_d8;
        }
        if (uVar15 < local_58._M_string_length + local_e0) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
              &local_58.field_2) {
            uVar16 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_58._M_string_length + local_e0) goto LAB_0014870b;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_e8);
        }
        else {
LAB_0014870b:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e8,
                              CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                       local_58._M_dataplus._M_p._0_4_));
        }
        local_128 = (ulong *)*puVar7;
        puVar9 = puVar7 + 2;
        if (local_128 == puVar9) {
          local_118 = *puVar9;
          uStack_110 = puVar7[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar9;
        }
        local_120 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)puVar9 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        local_108 = (undefined8 *)*puVar7;
        puVar10 = puVar7 + 2;
        if (local_108 == puVar10) {
          local_f8 = *puVar10;
          uStack_f0 = puVar7[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar10;
        }
        local_100 = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
      }
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
      pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (plVar6 + 2);
      if (local_c8._M_head_impl == pbVar12) {
        local_b8 = *(long *)pbVar12;
        lStack_b0 = plVar6[3];
        local_c8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
      }
      else {
        local_b8 = *(long *)pbVar12;
      }
      local_c0 = plVar6[1];
      *plVar6 = (long)pbVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
    }
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_a8._M_dataplus._M_p = (pointer)*plVar6;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_a8._M_dataplus._M_p == psVar11) {
      local_a8.field_2._M_allocated_capacity = *psVar11;
      local_a8.field_2._8_8_ = plVar6[3];
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      goto LAB_00148a23;
    }
  }
  local_a8.field_2._M_allocated_capacity = *psVar11;
LAB_00148a23:
  local_a8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DeathTestAbort(&local_a8);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}